

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O3

int ReadHashTable(int depth,int alpha,int beta,Movement *move)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  ulong uVar5;
  
  uVar4 = ((uint)ZobristKey & 0xffffff) << 5;
  lVar8 = 0;
  bVar9 = true;
  while (ZobristKeyCheck != *(UINT64 *)((long)&HashTable[lVar8].check + (ulong)uVar4)) {
    lVar8 = 1;
    bVar3 = !bVar9;
    bVar9 = false;
    if (bVar3) {
      return 0x100000;
    }
  }
  uVar5 = (ulong)uVar4;
  if (depth < *(int *)((long)&HashTable[lVar8].depth + uVar5)) {
    iVar7 = *(int *)((long)&HashTable[lVar8].value + uVar5);
    iVar6 = 0;
    if (0x26f8 < iVar7) {
      iVar6 = step;
    }
    iVar1 = *(int *)((long)&HashTable[lVar8].type + uVar5);
    iVar7 = iVar7 - iVar6;
    iVar6 = 0;
    if (iVar7 < -0x26f8) {
      iVar6 = step;
    }
    iVar6 = iVar6 + iVar7;
    if (iVar1 == 0) {
      return iVar6;
    }
    if (iVar1 == 2) {
      if (beta <= iVar6) {
        return beta;
      }
    }
    else if ((iVar1 == 1) && (iVar6 <= alpha)) {
      return alpha;
    }
  }
  uVar2 = *(undefined8 *)(&HashTable[lVar8].good_move.from + uVar5);
  *(undefined4 *)&move->catc = *(undefined4 *)(&HashTable[lVar8].good_move.catc + uVar5);
  *(undefined8 *)move = uVar2;
  return 0x100000;
}

Assistant:

int ReadHashTable(int depth, int alpha, int beta, Movement& move){
    int index = ZobristKey & HASHTABLE_MASK;

    for(int i = 0; i < 2; i++){
        HashNode hash_node = HashTable[index + i];
        // 判断校验值是否正确
        if(ZobristKeyCheck == hash_node.check){
            // 获取到的置换表结点的搜索深度应该较大才能认为是有效的
            if(hash_node.depth > depth){
                // 调整至相对值
                if(hash_node.value > WIN_VALUE){
                    hash_node.value -= step;
                }
                if(hash_node.value < -WIN_VALUE){
                    hash_node.value += step;
                }

                // PV结点 直接返回置换表中的值
                if(hash_node.type == hashEXACT){
                    return hash_node.value;
                }
                // alpha结点
                else if(hash_node.type == hashALPHA && hash_node.value <= alpha){
                    return alpha;
                }
                // beta结点
                else if(hash_node.type == hashBETA && hash_node.value >= beta){
                    return beta;
                }
            }
            // 读取失败就获得该局面的最佳走法
            move = hash_node.good_move;
            break;
        }
    }
    return NONE_VALUE;
}